

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
          (RepeatedEnumFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_FieldGenerator).options_ = options;
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedEnumFieldGenerator_004234c8;
  this->descriptor_ = descriptor;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  anon_unknown_3::SetEnumVariables(descriptor,&this->variables_,options);
  return;
}

Assistant:

RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : FieldGenerator(options), descriptor_(descriptor) {
  SetEnumVariables(descriptor, &variables_, options);
}